

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O0

bool_t prf_material_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  bool bVar1;
  int iVar2;
  bfile_t *bfile_00;
  ushort *in_RDI;
  int i;
  bfile_t *unaff_retaddr;
  node_data_conflict7 *data;
  int pos;
  float32_t in_stack_ffffffffffffffcc;
  bfile_t *in_stack_ffffffffffffffd0;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar3;
  
  if (*in_RDI == prf_material_palette_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    local_24 = 4;
    while (bfile_00 = (bfile_t *)(*(long *)(in_RDI + 4) + (long)local_24 + -4), iVar2 = local_24,
          local_24 + 4 <= (int)(uint)in_RDI[1]) {
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 4;
      if ((int)(uint)in_RDI[1] < local_24 + 8) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 8;
      if ((int)(uint)in_RDI[1] < local_24 + 0xc) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0xc;
      if ((int)(uint)in_RDI[1] < local_24 + 0x10) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x10;
      if ((int)(uint)in_RDI[1] < local_24 + 0x14) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x14;
      if ((int)(uint)in_RDI[1] < local_24 + 0x18) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x18;
      if ((int)(uint)in_RDI[1] < local_24 + 0x1c) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x1c;
      if ((int)(uint)in_RDI[1] < local_24 + 0x20) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x20;
      if ((int)(uint)in_RDI[1] < local_24 + 0x24) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x24;
      if ((int)(uint)in_RDI[1] < local_24 + 0x28) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x28;
      if ((int)(uint)in_RDI[1] < local_24 + 0x2c) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x2c;
      if ((int)(uint)in_RDI[1] < local_24 + 0x30) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x30;
      if ((int)(uint)in_RDI[1] < local_24 + 0x34) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x34;
      if ((int)(uint)in_RDI[1] < local_24 + 0x38) break;
      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x38;
      if ((int)(uint)in_RDI[1] < local_24 + 0x3c) break;
      bf_put_uint32_be(bfile_00,(uint32_t)in_stack_ffffffffffffffcc);
      iVar2 = local_24 + 0x3c;
      if ((int)(uint)in_RDI[1] < local_24 + 0x40) break;
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
      local_24 = local_24 + 0x48;
      in_stack_ffffffffffffffcc = 0.0;
      while( true ) {
        bVar1 = false;
        if ((int)in_stack_ffffffffffffffcc < 0x1c) {
          bVar1 = local_24 + 4 <= (int)(uint)in_RDI[1];
        }
        if (!bVar1) break;
        bf_put_uint32_be(bfile_00,(uint32_t)in_stack_ffffffffffffffcc);
        local_24 = local_24 + 4;
        in_stack_ffffffffffffffcc = (float32_t)((int)in_stack_ffffffffffffffcc + 1);
      }
    }
    local_24 = iVar2;
    if (local_24 < (int)(uint)in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar3 = 1;
  }
  else {
    prf_error(9,"tried material palette save method on node of type %d.",(ulong)*in_RDI);
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_material_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        int i;
        data = (node_data *) (node->data + pos - 4);
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            bf_put_uint32_be( bfile, data->reserved1[i] ); pos += 4;
        }
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}